

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O1

void __thiscall
slang::parsing::Preprocessor::applyPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  int iVar1;
  size_t __n;
  Diagnostic *this_00;
  char *__s1;
  size_type __rlen;
  string_view arg;
  SourceRange range;
  
  arg = Token::valueText(&pragma->name);
  __s1 = arg._M_str;
  __n = arg._M_len;
  switch(__n - 4) {
  case 0:
switchD_001ccbf5_caseD_0:
    iVar1 = bcmp(__s1,"once",__n);
    if (iVar1 == 0) {
      applyOncePragma(this,pragma);
      return;
    }
    if (__n != 10) goto switchD_001ccbf5_caseD_2;
    break;
  case 1:
switchD_001ccbf5_caseD_1:
    iVar1 = bcmp(__s1,"reset",__n);
    if (iVar1 == 0) {
      applyResetPragma(this,pragma);
      return;
    }
    if (__n == 4) goto switchD_001ccbf5_caseD_0;
    if (__n != 10) {
      if (__n != 8) goto switchD_001ccbf5_caseD_2;
      goto switchD_001ccbf5_caseD_4;
    }
    break;
  default:
    goto switchD_001ccbf5_caseD_2;
  case 3:
    iVar1 = bcmp(__s1,"protect",__n);
    if (iVar1 == 0) {
      applyProtectPragma(this,pragma,skippedTokens);
      return;
    }
    switch(__n - 4) {
    case 0:
      goto switchD_001ccbf5_caseD_0;
    case 1:
      goto switchD_001ccbf5_caseD_1;
    default:
      goto switchD_001ccbf5_caseD_2;
    case 4:
      goto switchD_001ccbf5_caseD_4;
    case 6:
      break;
    }
  case 4:
switchD_001ccbf5_caseD_4:
    iVar1 = bcmp(__s1,"resetall",__n);
    if (iVar1 == 0) {
      ensurePragmaArgs(this,pragma,0);
      this->protectEncryptDepth = 0;
      this->protectDecryptDepth = 0;
      this->protectLineLength = 0;
      this->protectBytes = 0;
      this->protectEncoding = Raw;
      return;
    }
    if (__n != 10) {
      if (__n != 4) goto switchD_001ccbf5_caseD_2;
      goto switchD_001ccbf5_caseD_0;
    }
    break;
  case 6:
    break;
  }
  iVar1 = bcmp(__s1,"diagnostic",__n);
  if (iVar1 == 0) {
    applyDiagnosticPragma(this,pragma);
    return;
  }
switchD_001ccbf5_caseD_2:
  range = Token::range(&pragma->name);
  this_00 = addDiag(this,(DiagCode)0x2b0004,range);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void Preprocessor::applyPragma(const PragmaDirectiveSyntax& pragma,
                               SmallVectorBase<Token>& skippedTokens) {
    std::string_view name = pragma.name.valueText();
    if (name == "protect") {
        applyProtectPragma(pragma, skippedTokens);
        return;
    }

    if (name == "reset") {
        applyResetPragma(pragma);
        return;
    }

    if (name == "resetall") {
        applyResetAllPragma(pragma);
        return;
    }

    if (name == "once") {
        applyOncePragma(pragma);
        return;
    }

    if (name == "diagnostic") {
        applyDiagnosticPragma(pragma);
        return;
    }

    // Otherwise, if the pragma is unknown warn and ignore.
    addDiag(diag::UnknownPragma, pragma.name.range()) << name;
}